

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::SetLanguageStandardProperty(cmTarget *this,string *lang,string *value,string *feature)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer pBVar2;
  pointer __s2;
  size_t sVar3;
  size_t __n;
  string *psVar4;
  int iVar5;
  mapped_type *pmVar6;
  pointer pBVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmListFileBacktrace featureBacktrace;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_88;
  string *local_78;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  
  local_78 = value;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_88);
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pBVar7 = *(pointer *)
            &((_Var1._M_head_impl)->CompileFeaturesEntries).
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  pBVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->CompileFeaturesEntries + 8);
  if (pBVar7 != pBVar2) {
    __s2 = (feature->_M_dataplus)._M_p;
    sVar3 = feature->_M_string_length;
    do {
      __n = *(size_type *)((long)&pBVar7->Value + 8);
      if ((__n == sVar3) &&
         ((__n == 0 || (iVar5 = bcmp(*(void **)&pBVar7->Value,__s2,__n), iVar5 == 0)))) {
        local_88.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = *(element_type **)
                   &(pBVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_88.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pBVar7->Backtrace + 8));
        break;
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar2);
  }
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_50._M_str = (lang->_M_dataplus)._M_p;
  local_50._M_len = lang->_M_string_length;
  local_40 = 9;
  local_38 = "_STANDARD";
  views._M_len = 2;
  views._M_array = &local_50;
  cmCatViews_abi_cxx11_(&local_70,views);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&(_Var1._M_head_impl)->LanguageStandardProperties,&local_70);
  psVar4 = local_78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  sVar3 = (pmVar6->Value)._M_string_length;
  if ((sVar3 != psVar4->_M_string_length) ||
     ((sVar3 != 0 &&
      (iVar5 = bcmp((pmVar6->Value)._M_dataplus._M_p,(psVar4->_M_dataplus)._M_p,sVar3), iVar5 != 0))
     )) {
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
              (&pmVar6->Backtraces);
  }
  std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
  emplace_back<cmListFileBacktrace&>
            ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)&pmVar6->Backtraces,
             (cmListFileBacktrace *)&local_88);
  if (local_88.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void cmTarget::SetLanguageStandardProperty(std::string const& lang,
                                           std::string const& value,
                                           const std::string& feature)
{
  cmListFileBacktrace featureBacktrace;
  for (auto const& entry : this->impl->CompileFeaturesEntries) {
    if (entry.Value == feature) {
      featureBacktrace = entry.Backtrace;
      break;
    }
  }

  BTs<std::string>& languageStandardProperty =
    this->impl->LanguageStandardProperties[cmStrCat(lang, "_STANDARD")];
  if (languageStandardProperty.Value != value) {
    languageStandardProperty.Value = value;
    languageStandardProperty.Backtraces.clear();
  }
  languageStandardProperty.Backtraces.emplace_back(featureBacktrace);
}